

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall
mkvparser::Tags::Tags
          (Tags *this,Segment *pSegment,longlong payload_start,longlong payload_size,
          longlong element_start,longlong element_size)

{
  longlong element_size_local;
  longlong element_start_local;
  longlong payload_size_local;
  longlong payload_start_local;
  Segment *pSegment_local;
  Tags *this_local;
  
  this->m_pSegment = pSegment;
  this->m_start = payload_start;
  this->m_size = payload_size;
  this->m_element_start = element_start;
  this->m_element_size = element_size;
  this->m_tags = (Tag *)0x0;
  this->m_tags_size = 0;
  this->m_tags_count = 0;
  return;
}

Assistant:

Tags::Tags(Segment* pSegment, long long payload_start, long long payload_size,
           long long element_start, long long element_size)
    : m_pSegment(pSegment),
      m_start(payload_start),
      m_size(payload_size),
      m_element_start(element_start),
      m_element_size(element_size),
      m_tags(NULL),
      m_tags_size(0),
      m_tags_count(0) {}